

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O1

void serialization::unserialize_helper<serialization::json_iarchive,Person>
               (json_iarchive *ar,vector<Person,_std::allocator<Person>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type i;
  Person tmp;
  Person local_58;
  
  sVar2 = json_iarchive::load_sequence_start(ar);
  std::vector<Person,_std::allocator<Person>_>::reserve(v,(ulong)sVar2);
  if (sVar2 != 0) {
    i = 0;
    paVar1 = &local_58.name.field_2;
    do {
      json_iarchive::load_sequence_item_start(ar,i);
      local_58.name._M_string_length = 0;
      local_58.name.field_2._M_local_buf[0] = '\0';
      local_58.name._M_dataplus._M_p = (pointer)paVar1;
      json_iarchive::load_object_start(ar);
      Person::unserialize_impl<serialization::json_iarchive>(&local_58,ar);
      std::vector<Person,_std::allocator<Person>_>::emplace_back<Person>(v,&local_58);
      json_iarchive::load_sequence_item_end(ar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.name._M_dataplus._M_p,
                        CONCAT71(local_58.name.field_2._M_allocated_capacity._1_7_,
                                 local_58.name.field_2._M_local_buf[0]) + 1);
      }
      i = i + 1;
    } while (sVar2 != i);
  }
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}